

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O0

void predict_or_learn<false>(bs *d,single_learner *base,example *ec)

{
  float fVar1;
  uint32_t uVar2;
  ostream *poVar3;
  vw_exception *this;
  char *pfile;
  long in_RDX;
  uint *in_RDI;
  stringstream __msg;
  size_t i;
  stringstream outputStringStream;
  float weight_temp;
  bool shouldOutput;
  vw *all;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  example *in_stack_fffffffffffffbf8;
  code *pcVar4;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  undefined4 uVar5;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc38;
  example *in_stack_fffffffffffffc40;
  string local_3a0 [39];
  undefined1 local_379;
  stringstream local_358 [16];
  ostream local_348;
  double local_1d0;
  ulong local_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0;
  float local_28;
  byte local_21;
  long local_20;
  long local_18;
  uint *local_8;
  
  local_20 = *(long *)(in_RDI + 8);
  local_21 = 0 < *(int *)(local_20 + 0x3530);
  local_28 = *(float *)(in_RDX + 0x6870);
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2ce275);
  for (local_1b8 = 1; fVar1 = local_28, local_1b8 <= *local_8; local_1b8 = local_1b8 + 1) {
    uVar2 = BS::weight_gen((vw *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    *(float *)(local_18 + 0x6870) = fVar1 * (float)uVar2;
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)
               CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
               (example *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    local_1d0 = (double)*(float *)(local_18 + 0x6850);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (value_type_conflict4 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
              );
    if ((local_21 & 1) != 0) {
      if (1 < local_1b8) {
        std::operator<<(&local_1a0,' ');
      }
      poVar3 = (ostream *)std::ostream::operator<<(&local_1a0,local_1b8);
      poVar3 = std::operator<<(poVar3,':');
      std::ostream::operator<<(poVar3,*(float *)(local_18 + 0x68a8));
    }
  }
  *(float *)(local_18 + 0x6870) = local_28;
  if (*(long *)(local_8 + 2) == 0) {
    bs_predict_mean((vw *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                    in_stack_fffffffffffffbf8,
                    (vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  }
  else {
    if (*(long *)(local_8 + 2) != 1) {
      std::__cxx11::stringstream::stringstream(local_358);
      this = (vw_exception *)std::operator<<(&local_348,"Unknown bs_type specified: ");
      std::ostream::operator<<(this,*(ulong *)(local_8 + 2));
      local_379 = 1;
      pfile = (char *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (this,pfile,in_stack_fffffffffffffc04,(string *)in_stack_fffffffffffffbf8);
      local_379 = 0;
      __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    bs_predict_vote(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  }
  if ((local_21 & 1) != 0) {
    pcVar4 = *(code **)(local_20 + 0x3540);
    uVar5 = *(undefined4 *)(local_20 + 0x3530);
    std::__cxx11::stringstream::str();
    (*pcVar4)(uVar5,local_3a0);
    std::__cxx11::string::~string(local_3a0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void predict_or_learn(bs& d, single_learner& base, example& ec)
{
  vw& all = *d.all;
  bool shouldOutput = all.raw_prediction > 0;

  float weight_temp = ec.weight;

  stringstream outputStringStream;
  d.pred_vec->clear();

  for (size_t i = 1; i <= d.B; i++)
  {
    ec.weight = weight_temp * (float)BS::weight_gen(all);

    if (is_learn)
      base.learn(ec, i - 1);
    else
      base.predict(ec, i - 1);

    d.pred_vec->push_back(ec.pred.scalar);

    if (shouldOutput)
    {
      if (i > 1)
        outputStringStream << ' ';
      outputStringStream << i << ':' << ec.partial_prediction;
    }
  }

  ec.weight = weight_temp;

  switch (d.bs_type)
  {
    case BS_TYPE_MEAN:
      bs_predict_mean(all, ec, *d.pred_vec);
      break;
    case BS_TYPE_VOTE:
      bs_predict_vote(ec, *d.pred_vec);
      break;
    default:
      THROW("Unknown bs_type specified: " << d.bs_type);
  }

  if (shouldOutput)
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
}